

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fft.c
# Opt level: O3

void aom_ifft_2d_gen(float *input,float *temp,float *output,int n,aom_fft_1d_func_t fft_single,
                    aom_fft_1d_func_t fft_multi,aom_fft_1d_func_t ifft_multi,
                    aom_fft_transpose_func_t transpose,int vec_size)

{
  ulong uVar1;
  float *pfVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  long lVar10;
  long lVar11;
  int x;
  uint uVar12;
  ulong uVar14;
  ulong uVar15;
  float *pfVar16;
  ulong uVar17;
  ulong uVar18;
  float fVar19;
  long local_b8;
  long local_a8;
  float *local_a0;
  float *local_68;
  long local_60;
  ulong uVar13;
  
  uVar12 = n / 2;
  uVar13 = (ulong)uVar12;
  uVar17 = (ulong)(int)uVar12;
  if (n < -1) {
    uVar15 = (ulong)(uVar12 + 1);
  }
  else {
    uVar15 = (ulong)(uVar12 + 1);
    iVar4 = 0;
    lVar6 = 0;
    uVar7 = uVar15;
    do {
      *(float *)((long)output + lVar6) = input[iVar4];
      *(undefined4 *)((long)output + lVar6 + 4) =
           *(undefined4 *)((long)input + lVar6 * 2 + uVar17 * 8);
      lVar6 = lVar6 + (long)n * 4;
      iVar4 = iVar4 + n * 2;
      uVar7 = uVar7 - 1;
    } while (uVar7 != 0);
  }
  iVar4 = (int)uVar15;
  if (iVar4 < n) {
    lVar10 = (long)n;
    lVar6 = (uVar17 + 1) * lVar10;
    iVar5 = n * 2 + 1;
    lVar8 = ~uVar17 + lVar10;
    lVar11 = 0;
    do {
      *(float *)((long)output + lVar11 + lVar6 * 4) = input[iVar5];
      *(undefined4 *)((long)output + lVar11 + lVar6 * 4 + 4) =
           *(undefined4 *)((long)input + lVar11 * 2 + (uVar17 + lVar10) * 8 + 4);
      lVar11 = lVar11 + lVar10 * 4;
      iVar5 = iVar5 + n * 2;
      lVar8 = lVar8 + -1;
    } while (lVar8 != 0);
  }
  lVar6 = (long)vec_size;
  lVar8 = 0;
  pfVar2 = temp;
  pfVar16 = output;
  do {
    (*ifft_multi)(pfVar16,pfVar2,n);
    lVar8 = lVar8 + lVar6;
    pfVar16 = pfVar16 + lVar6;
    pfVar2 = pfVar2 + lVar6;
  } while (lVar8 < 2);
  uVar7 = (ulong)(uint)n;
  if (0 < n) {
    uVar1 = 2;
    if (2 < (int)uVar12) {
      uVar1 = uVar13;
    }
    pfVar2 = input + 3;
    lVar8 = uVar17 + 1;
    uVar17 = 0;
    uVar9 = 0;
    do {
      if (3 < (uint)n) {
        lVar10 = 0;
        do {
          output[uVar17 + lVar10 + 2] = input[uVar17 * 2 + lVar10 * 2 + 2];
          lVar10 = lVar10 + 1;
        } while (uVar1 - 1 != lVar10);
        if (3 < (uint)n) {
          lVar10 = 0;
          do {
            output[(int)lVar10 + (int)lVar8] = pfVar2[lVar10 * 2];
            lVar10 = lVar10 + 1;
          } while (uVar1 - 1 != lVar10);
        }
      }
      uVar9 = uVar9 + 1;
      uVar17 = (ulong)(uint)((int)uVar17 + n);
      pfVar2 = pfVar2 + uVar7 * 2;
      lVar8 = lVar8 + uVar7;
    } while (uVar9 != uVar7);
  }
  if (2 < vec_size) {
    pfVar2 = temp + 2;
    pfVar16 = output + 2;
    lVar8 = (ulong)(uint)vec_size - 2;
    do {
      (*fft_single)(pfVar16,pfVar2,n);
      pfVar2 = pfVar2 + 1;
      pfVar16 = pfVar16 + 1;
      lVar8 = lVar8 + -1;
    } while (lVar8 != 0);
  }
  uVar3 = 2;
  if (2 < vec_size) {
    uVar3 = vec_size;
  }
  if ((int)uVar3 < n) {
    uVar17 = (ulong)uVar3;
    pfVar2 = output + uVar17;
    pfVar16 = temp + uVar17;
    do {
      (*fft_multi)(pfVar2,pfVar16,n);
      uVar17 = uVar17 + lVar6;
      pfVar2 = pfVar2 + lVar6;
      pfVar16 = pfVar16 + lVar6;
    } while ((long)uVar17 < (long)uVar7);
  }
  if (0 < n) {
    pfVar2 = temp + 1;
    uVar17 = 0;
    do {
      output[uVar17] = pfVar2[-1];
      output[uVar12 * n + uVar17] = *pfVar2;
      uVar17 = uVar17 + 1;
      pfVar2 = pfVar2 + uVar7;
    } while (uVar7 != uVar17);
    if (3 < n) {
      uVar17 = 2;
      if (2 < (int)uVar12) {
        uVar17 = uVar13;
      }
      uVar12 = uVar12 + 1;
      local_a0 = output + uVar7 + 1;
      uVar1 = uVar7 - 1;
      local_a8 = uVar13 * 4 + uVar1 * uVar7 * 4;
      lVar8 = (uVar1 - uVar13) * uVar7;
      local_60 = lVar8 * 4 + 8;
      uVar3 = n * uVar12;
      local_b8 = uVar13 * uVar7 * 4 + 8;
      local_68 = output + (uVar13 + 1) * uVar7 + 1;
      lVar10 = uVar13 * 4 + 4 + lVar8 * 4;
      lVar8 = uVar1 * uVar7 * 4 + 8;
      uVar14 = 1;
      lVar11 = 8;
      uVar9 = (ulong)(uint)n;
      do {
        local_a8 = local_a8 + 4;
        uVar18 = 0;
        pfVar2 = temp;
        do {
          fVar19 = 0.0;
          if (uVar18 < uVar13 && uVar18 != 0) {
            fVar19 = pfVar2[(ulong)uVar12 + uVar13 * uVar7];
          }
          output[uVar9 + uVar18] = fVar19 + *(float *)((long)pfVar2 + lVar11);
          uVar18 = uVar18 + 1;
          pfVar2 = pfVar2 + uVar7;
        } while (uVar15 != uVar18);
        pfVar2 = temp;
        uVar18 = uVar13;
        if (iVar4 < n) {
          do {
            local_a0[uVar18] =
                 *(float *)((long)pfVar2 + local_60) - *(float *)((long)pfVar2 + local_a8);
            uVar18 = uVar18 + 1;
            pfVar2 = pfVar2 + -uVar7;
          } while (uVar1 != uVar18);
        }
        uVar18 = 0;
        pfVar2 = temp;
        do {
          fVar19 = 0.0;
          if (uVar18 < uVar13 && uVar18 != 0) {
            fVar19 = *(float *)((long)pfVar2 + local_b8);
          }
          output[uVar3 + uVar18] = pfVar2[uVar12] - fVar19;
          uVar18 = uVar18 + 1;
          pfVar2 = pfVar2 + uVar7;
        } while (uVar15 != uVar18);
        pfVar2 = temp;
        uVar18 = uVar13;
        if (iVar4 < n) {
          do {
            local_68[uVar18] = *(float *)((long)pfVar2 + lVar8) + *(float *)((long)pfVar2 + lVar10);
            uVar18 = uVar18 + 1;
            pfVar2 = pfVar2 + -uVar7;
          } while (uVar1 != uVar18);
        }
        uVar14 = uVar14 + 1;
        lVar11 = lVar11 + 4;
        uVar12 = uVar12 + 1;
        local_a0 = local_a0 + uVar7;
        local_60 = local_60 + 4;
        uVar3 = uVar3 + n;
        local_b8 = local_b8 + 4;
        local_68 = local_68 + uVar7;
        uVar9 = (ulong)(uint)((int)uVar9 + n);
        lVar10 = lVar10 + 4;
        lVar8 = lVar8 + 4;
      } while (uVar14 != uVar17);
    }
    if (0 < n) {
      lVar8 = 0;
      pfVar2 = temp;
      pfVar16 = output;
      do {
        (*ifft_multi)(pfVar16,pfVar2,n);
        lVar8 = lVar8 + lVar6;
        pfVar16 = pfVar16 + lVar6;
        pfVar2 = pfVar2 + lVar6;
      } while (lVar8 < (long)uVar7);
    }
  }
  (*transpose)(temp,output,n);
  return;
}

Assistant:

void aom_ifft_2d_gen(const float *input, float *temp, float *output, int n,
                     aom_fft_1d_func_t fft_single, aom_fft_1d_func_t fft_multi,
                     aom_fft_1d_func_t ifft_multi,
                     aom_fft_transpose_func_t transpose, int vec_size) {
  // Column 0 and n/2 have conjugate symmetry, so we can directly do the ifft
  // and get real outputs.
  for (int y = 0; y <= n / 2; ++y) {
    output[y * n] = input[2 * y * n];
    output[y * n + 1] = input[2 * (y * n + n / 2)];
  }
  for (int y = n / 2 + 1; y < n; ++y) {
    output[y * n] = input[2 * (y - n / 2) * n + 1];
    output[y * n + 1] = input[2 * ((y - n / 2) * n + n / 2) + 1];
  }

  for (int i = 0; i < 2; i += vec_size) {
    ifft_multi(output + i, temp + i, n);
  }

  // For the other columns, since we don't have a full ifft for complex inputs
  // we have to split them into the real and imaginary counterparts.
  // Pack the real component, then the imaginary components.
  for (int y = 0; y < n; ++y) {
    for (int x = 1; x < n / 2; ++x) {
      output[y * n + (x + 1)] = input[2 * (y * n + x)];
    }
    for (int x = 1; x < n / 2; ++x) {
      output[y * n + (x + n / 2)] = input[2 * (y * n + x) + 1];
    }
  }
  for (int y = 2; y < vec_size; y++) {
    fft_single(output + y, temp + y, n);
  }
  // This is the part that can be sped up with SIMD
  for (int y = AOMMAX(2, vec_size); y < n; y += vec_size) {
    fft_multi(output + y, temp + y, n);
  }

  // Put the 0 and n/2 th results in the correct place.
  for (int x = 0; x < n; ++x) {
    output[x] = temp[x * n];
    output[(n / 2) * n + x] = temp[x * n + 1];
  }
  // This rearranges and transposes.
  for (int y = 1; y < n / 2; ++y) {
    // Fill in the real columns
    for (int x = 0; x <= n / 2; ++x) {
      output[x + y * n] =
          temp[(y + 1) + x * n] +
          ((x > 0 && x < n / 2) ? temp[(y + n / 2) + (x + n / 2) * n] : 0);
    }
    for (int x = n / 2 + 1; x < n; ++x) {
      output[x + y * n] = temp[(y + 1) + (n - x) * n] -
                          temp[(y + n / 2) + ((n - x) + n / 2) * n];
    }
    // Fill in the imag columns
    for (int x = 0; x <= n / 2; ++x) {
      output[x + (y + n / 2) * n] =
          temp[(y + n / 2) + x * n] -
          ((x > 0 && x < n / 2) ? temp[(y + 1) + (x + n / 2) * n] : 0);
    }
    for (int x = n / 2 + 1; x < n; ++x) {
      output[x + (y + n / 2) * n] = temp[(y + 1) + ((n - x) + n / 2) * n] +
                                    temp[(y + n / 2) + (n - x) * n];
    }
  }
  for (int y = 0; y < n; y += vec_size) {
    ifft_multi(output + y, temp + y, n);
  }
  transpose(temp, output, n);
}